

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O3

void __thiscall chrono::ChForce::ChForce(ChForce *this)

{
  double dVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ChFunction *__tmp;
  undefined1 auVar8 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar9 [32];
  
  ChObj::ChObj(&this->super_ChObj);
  (this->super_ChObj)._vptr_ChObj = (_func_int **)&PTR__ChForce_00b03cc0;
  this->Body = (ChBody *)0x0;
  this->mode = FORCE;
  this->frame = BODY;
  this->align = BODY_DIR;
  auVar6 = _DAT_00b689a0;
  auVar8._8_8_ = VNULL;
  auVar8._0_8_ = VNULL;
  auVar9._16_8_ = VNULL;
  auVar9._0_16_ = auVar8;
  auVar9._24_8_ = VNULL;
  auVar10 = vpermpd_avx2(ZEXT1632(_DAT_00b689a0),0xd0);
  auVar10 = vblendps_avx(auVar9,auVar10,0x3c);
  this->vpoint = (ChVector<double>)auVar10._0_24_;
  (this->vrelpoint).m_data[0] = (double)auVar10._24_8_;
  *(undefined1 (*) [16])((this->vrelpoint).m_data + 1) = auVar6;
  auVar10 = ZEXT1232(ZEXT812(0)) << 0x20;
  this->move_x = (shared_ptr<chrono::ChFunction>)auVar10._0_16_;
  this->move_y = (shared_ptr<chrono::ChFunction>)auVar10._16_16_;
  this->move_y = (shared_ptr<chrono::ChFunction>)auVar10._0_16_;
  this->move_z = (shared_ptr<chrono::ChFunction>)auVar10._16_16_;
  auVar11 = ZEXT464(0) << 0x20;
  dVar1 = (double)vmovlps_avx(auVar8);
  (this->restpos).m_data[0] = dVar1;
  *(undefined1 (*) [16])((this->restpos).m_data + 1) = auVar6;
  (this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->f_x = (shared_ptr<chrono::ChFunction>)auVar11._0_16_;
  this->f_y = (shared_ptr<chrono::ChFunction>)auVar11._16_16_;
  this->f_z = (shared_ptr<chrono::ChFunction>)auVar11._32_16_;
  this->mforce = (double)auVar11._48_8_;
  (this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar11._56_8_;
  auVar3._8_8_ = DAT_00b689b8;
  auVar3._0_8_ = VECT_X;
  auVar5._8_8_ = DAT_00b689c0;
  auVar5._0_8_ = DAT_00b689b8;
  auVar4 = vunpcklpd_avx(auVar3,auVar5);
  auVar3 = vshufpd_avx(auVar5,auVar3,1);
  *(undefined1 (*) [16])((this->vdir).m_data + 2) = auVar3;
  *(undefined1 (*) [16])(this->vdir).m_data = auVar4;
  *(undefined1 (*) [16])((this->vreldir).m_data + 1) = auVar5;
  dVar1 = (double)vmovlps_avx(auVar8);
  (this->force).m_data[0] = dVar1;
  *(undefined1 (*) [16])((this->force).m_data + 1) = auVar6;
  dVar1 = (double)vmovlps_avx(auVar8);
  (this->relforce).m_data[0] = dVar1;
  *(undefined1 (*) [16])((this->relforce).m_data + 1) = auVar6;
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var7->_M_use_count = 1;
  p_Var7->_M_weak_count = 1;
  p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var7[1]._M_use_count = 0;
  p_Var7[1]._M_weak_count = 0x3ff00000;
  (this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var7 + 1);
  p_Var2 = (this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var7;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var7->_M_use_count = 1;
  p_Var7->_M_weak_count = 1;
  p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var7[1]._M_use_count = 0;
  p_Var7[1]._M_weak_count = 0;
  (this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var7 + 1);
  p_Var2 = (this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var7;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var7->_M_use_count = 1;
  p_Var7->_M_weak_count = 1;
  p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var7[1]._M_use_count = 0;
  p_Var7[1]._M_weak_count = 0;
  (this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var7 + 1);
  p_Var2 = (this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var7;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var7->_M_use_count = 1;
  p_Var7->_M_weak_count = 1;
  p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var7[1]._M_use_count = 0;
  p_Var7[1]._M_weak_count = 0;
  (this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var7 + 1);
  p_Var2 = (this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var7;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var7->_M_use_count = 1;
  p_Var7->_M_weak_count = 1;
  p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var7[1]._M_use_count = 0;
  p_Var7[1]._M_weak_count = 0;
  (this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var7 + 1);
  p_Var2 = (this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var7;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var7->_M_use_count = 1;
  p_Var7->_M_weak_count = 1;
  p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var7[1]._M_use_count = 0;
  p_Var7[1]._M_weak_count = 0;
  (this->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var7 + 1);
  p_Var2 = (this->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var7;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var7->_M_use_count = 1;
  p_Var7->_M_weak_count = 1;
  p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var7[1]._M_use_count = 0;
  p_Var7[1]._M_weak_count = 0;
  (this->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var7 + 1);
  p_Var2 = (this->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var7;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    return;
  }
  return;
}

Assistant:

ChForce::ChForce()
    : Body(nullptr),
      mode(FORCE),
      frame(BODY),
      align(BODY_DIR),
      vpoint(VNULL),
      vrelpoint(VNULL),
      restpos(VNULL),
      mforce(0),
      vdir(VECT_X),
      vreldir(VECT_X),
      force(VNULL),
      relforce(VNULL) {
    modula = chrono_types::make_shared<ChFunction_Const>(1);
    move_x = chrono_types::make_shared<ChFunction_Const>(0);
    move_y = chrono_types::make_shared<ChFunction_Const>(0);
    move_z = chrono_types::make_shared<ChFunction_Const>(0);
    f_x = chrono_types::make_shared<ChFunction_Const>(0);
    f_y = chrono_types::make_shared<ChFunction_Const>(0);
    f_z = chrono_types::make_shared<ChFunction_Const>(0);
}